

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ExternalInstancePtr *name)

{
  size_type sVar1;
  GlobalName *extraout_RDX;
  GlobalName *extraout_RDX_00;
  GlobalName *u;
  char local_28 [8];
  string *psStack_20;
  
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->import_syms_,(name->super_GlobalName).name);
  u = extraout_RDX;
  if (sVar1 == 0) {
    WriteData(this,"&",1);
    u = extraout_RDX_00;
  }
  local_28 = *(char (*) [8])&name->super_GlobalName;
  psStack_20 = (name->super_GlobalName).name;
  (anonymous_namespace)::CWriter::Write<char_const(&)[11],wabt::(anonymous_namespace)::GlobalName>
            ((CWriter *)this,(char (*) [11])local_28,u);
  return;
}

Assistant:

void CWriter::Write(const ExternalInstancePtr& name) {
  bool is_import = import_syms_.count(name.name) != 0;
  if (!is_import) {
    Write("&");
  }
  Write("instance->", GlobalName(name));
}